

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
llvm::cl::HideUnrelatedOptions
          (cl *this,ArrayRef<const_llvm::cl::OptionCategory_*> Categories,SubCommand *Sub)

{
  uint uVar1;
  long lVar2;
  StringMapEntryBase *pSVar3;
  size_t sVar4;
  cl *pcVar5;
  size_type sVar6;
  iterator __begin1;
  StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
  local_38;
  
  sVar6 = Categories.Length;
  local_38.Ptr = (StringMapEntryBase **)
                 StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::begin
                           ((StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *)(sVar6 + 0x80));
  uVar1 = *(uint *)(sVar6 + 0x88);
  lVar2 = *(long *)(sVar6 + 0x80);
  while (local_38.Ptr != (StringMapEntryBase **)((ulong)uVar1 * 8 + lVar2)) {
    pSVar3 = *local_38.Ptr;
    pcVar5 = (cl *)std::
                   __find_if<llvm::cl::OptionCategory_const*const*,__gnu_cxx::__ops::_Iter_equals_val<llvm::cl::OptionCategory*const>>
                             (this,this + (long)Categories.Data * 8,pSVar3[1].StrLen + 0x48);
    if ((pcVar5 == this + (long)Categories.Data * 8) &&
       (sVar4 = pSVar3[1].StrLen, *(OptionCategory **)(sVar4 + 0x48) != &GenericCategory)) {
      *(ushort *)(sVar4 + 0xc) = (ushort)*(undefined4 *)(sVar4 + 0xc) & 0xff9f | 0x40;
    }
    StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void cl::HideUnrelatedOptions(ArrayRef<const cl::OptionCategory *> Categories,
                              SubCommand &Sub) {
  auto CategoriesBegin = Categories.begin();
  auto CategoriesEnd = Categories.end();
  for (auto &I : Sub.OptionsMap) {
    if (std::find(CategoriesBegin, CategoriesEnd, I.second->Category) ==
            CategoriesEnd &&
        I.second->Category != &GenericCategory)
      I.second->setHiddenFlag(cl::ReallyHidden);
  }
}